

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall
ON_SubDEdgeChain::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdgeChain *this)

{
  uint uVar1;
  ON_SubDEdgePtr *pOVar2;
  long lVar3;
  ON_SubDEdge *edge;
  ulong uVar4;
  ON__INT32 OVar5;
  uint uVar6;
  ulong uVar7;
  ON_SHA1 local_b8;
  
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  uVar1 = EdgeCount(this);
  if (uVar1 != 0) {
    uVar7 = 0;
    do {
      pOVar2 = (this->m_edge_chain).m_a + uVar7;
      if ((this->m_edge_chain).m_count <= (int)uVar7) {
        pOVar2 = &ON_SubDEdgePtr::Null;
      }
      if ((int)uVar7 < 0) {
        pOVar2 = &ON_SubDEdgePtr::Null;
      }
      uVar4 = pOVar2->m_ptr & 0xfffffffffffffff8;
      uVar6 = (uint)pOVar2->m_ptr;
      if (uVar4 == 0) {
        ON_SHA1::AccumulateInteger32(&local_b8,0);
        lVar3 = 0;
      }
      else {
        ON_SHA1::AccumulateInteger32(&local_b8,*(ON__INT32 *)(uVar4 + 8));
        lVar3 = *(long *)(uVar4 + 0x80 + (ulong)(uVar6 & 1) * 8);
      }
      if (lVar3 == 0) {
        OVar5 = 0;
      }
      else {
        OVar5 = *(ON__INT32 *)(lVar3 + 8);
      }
      ON_SHA1::AccumulateInteger32(&local_b8,OVar5);
      if (uVar4 == 0) {
        lVar3 = 0;
      }
      else {
        lVar3 = *(long *)(uVar4 + 0x80 + (ulong)(~uVar6 & 1) * 8);
      }
      if (lVar3 == 0) {
        OVar5 = 0;
      }
      else {
        OVar5 = *(ON__INT32 *)(lVar3 + 8);
      }
      ON_SHA1::AccumulateInteger32(&local_b8,OVar5);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdgeChain::Hash() const
{
  ON_SHA1 sha1;
  const unsigned edge_count = this->EdgeCount();
  for (unsigned i = 0; i < edge_count; ++i)
  {
    const ON_SubDEdgePtr eptr = EdgePtr(i);
    sha1.AccumulateInteger32(eptr.EdgeId());
    sha1.AccumulateInteger32(eptr.RelativeVertexId(0));
    sha1.AccumulateInteger32(eptr.RelativeVertexId(1));
  }
  return sha1.Hash();
}